

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventAgentT.h
# Opt level: O0

void __thiscall
AsyncEventAgent10<TestClass,_unsigned_int,_short,_TestClass_*,_char_*,_int,_bool,_char,_unsigned_char,_unsigned_short,_unsigned_long>
::deliver(AsyncEventAgent10<TestClass,_unsigned_int,_short,_TestClass_*,_char_*,_int,_bool,_char,_unsigned_char,_unsigned_short,_unsigned_long>
          *this)

{
  bool *pbVar1;
  code *local_48;
  AsyncEventAgent10<TestClass,_unsigned_int,_short,_TestClass_*,_char_*,_int,_bool,_char,_unsigned_char,_unsigned_short,_unsigned_long>
  *this_local;
  
  local_48 = (code *)this->mMethod;
  pbVar1 = &this->mObject->mTheBool + *(long *)&this->field_0x28;
  if (((ulong)local_48 & 1) != 0) {
    local_48 = *(code **)(local_48 + *(long *)pbVar1 + -1);
  }
  (*local_48)(pbVar1,this->mParam1,(int)this->mParam2,this->mParam3,this->mParam4,this->mParam5,
              this->mParam6 & 1,(int)this->mParam7,this->mParam8,this->mParam9,this->mParam10);
  return;
}

Assistant:

void deliver()
	{
		(mObject->*mMethod)(mParam1, mParam2, mParam3, mParam4,
						  mParam5, mParam6, mParam7, mParam8,
						  mParam9, mParam10);
	}